

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

void Abc_NtkSortCubes(Abc_Ntk_t *pNtk,int fWeight)

{
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vCubes;
  void **ppvVar1;
  Vec_Str_t *vStore;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  if (pNtk->ntkFunc == ABC_FUNC_SOP) {
    vCubes = (Vec_Ptr_t *)malloc(0x10);
    vCubes->nCap = 1000;
    vCubes->nSize = 0;
    ppvVar1 = (void **)malloc(8000);
    vCubes->pArray = ppvVar1;
    vStore = (Vec_Str_t *)malloc(0x10);
    vStore->nCap = 1000;
    vStore->nSize = 0;
    pcVar2 = (char *)malloc(1000);
    vStore->pArray = pcVar2;
    pVVar3 = pNtk->vObjs;
    if (0 < pVVar3->nSize) {
      lVar4 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar3->pArray[lVar4];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          Abc_NodeSortCubes(pNode,vCubes,vStore,fWeight);
        }
        lVar4 = lVar4 + 1;
        pVVar3 = pNtk->vObjs;
      } while (lVar4 < pVVar3->nSize);
    }
    if (vStore->pArray != (char *)0x0) {
      free(vStore->pArray);
      vStore->pArray = (char *)0x0;
    }
    free(vStore);
    if (vCubes->pArray != (void **)0x0) {
      free(vCubes->pArray);
      vCubes->pArray = (void **)0x0;
    }
    free(vCubes);
    return;
  }
  __assert_fail("Abc_NtkHasSop(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                ,499,"void Abc_NtkSortCubes(Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkSortCubes( Abc_Ntk_t * pNtk, int fWeight )
{
    Vec_Ptr_t * vCubes;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkHasSop(pNtk) );
    vCubes = Vec_PtrAlloc( 1000 );
    vStore = Vec_StrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        Abc_NodeSortCubes( pNode, vCubes, vStore, fWeight );
    Vec_StrFree( vStore );
    Vec_PtrFree( vCubes );
}